

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockpacking.h
# Opt level: O1

void __thiscall
FastPForLib::BP32::encodeArray(BP32 *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint32_t *puVar4;
  uint32_t *puVar5;
  uint32_t i;
  long lVar6;
  long lVar7;
  uint32_t uVar8;
  uint *out_00;
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  uint32_t Bs [4];
  uint32_t local_58 [3];
  uint local_4c;
  uint32_t *local_48;
  size_t *local_40;
  uint32_t *local_38;
  
  local_40 = nvalue;
  checkifdivisibleby(length,0x80);
  out_00 = out + 1;
  *out = (uint32_t)length;
  local_48 = out;
  if (0x7f < (long)length) {
    local_38 = in + length;
    puVar5 = in + 0x80;
    do {
      puVar4 = in;
      lVar6 = 0;
      do {
        lVar1 = lVar6 + 1;
        auVar10 = ZEXT1664((undefined1  [16])0x0);
        lVar7 = 0;
        do {
          auVar10 = vpord_avx512f(auVar10,*(undefined1 (*) [64])(puVar4 + lVar7));
          lVar7 = lVar7 + 0x10;
        } while (lVar7 != 0x20);
        auVar9 = vextracti64x4_avx512f(auVar10,1);
        auVar10 = vpord_avx512f(auVar10,ZEXT3264(auVar9));
        auVar2 = vpor_avx(auVar10._0_16_,auVar10._16_16_);
        auVar3 = vpshufd_avx(auVar2,0xee);
        auVar2 = vpor_avx(auVar2,auVar3);
        auVar3 = vpshufd_avx(auVar2,0x55);
        auVar2 = vpor_avx(auVar2,auVar3);
        uVar8 = 0x20 - LZCOUNT(auVar2._0_4_);
        if (auVar2._0_4_ == 0) {
          uVar8 = 0;
        }
        local_58[lVar6] = uVar8;
        puVar4 = puVar4 + 0x20;
        lVar6 = lVar1;
      } while (lVar1 != 4);
      *out_00 = local_58[2] << 8 | local_58[1] << 0x10 | local_58[0] << 0x18 | local_4c;
      out_00 = out_00 + 1;
      lVar6 = 0;
      puVar4 = in;
      do {
        fastpackwithoutmask(puVar4,out_00,local_58[lVar6]);
        out_00 = out_00 + local_58[lVar6];
        lVar6 = lVar6 + 1;
        puVar4 = puVar4 + 0x20;
      } while (lVar6 != 4);
      puVar5 = puVar5 + 0x80;
      in = in + 0x80;
    } while (puVar5 <= local_38);
  }
  *local_40 = (long)out_00 - (long)local_48 >> 2;
  return;
}

Assistant:

void encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                   size_t &nvalue) override {
    checkifdivisibleby(length, BlockSize);
    const uint32_t *const initout(out);
    *out++ = static_cast<uint32_t>(length);
    uint32_t Bs[HowManyMiniBlocks];
    for (const uint32_t *const final = in + length; in + BlockSize <= final;
         in += BlockSize) {
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i)
        Bs[i] = maxbits(in + i * MiniBlockSize, in + (i + 1) * MiniBlockSize);
      *out++ = (Bs[0] << 24) | (Bs[1] << 16) | (Bs[2] << 8) | Bs[3];
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i) {
        fastpackwithoutmask(in + i * MiniBlockSize, out, Bs[i]);
        out += Bs[i];
      }
    }
    nvalue = out - initout;
  }